

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O2

void shared_strings_callback_find_shared_string_start
               (void *callbackdata,XML_Char *name,XML_Char **atts)

{
  int iVar1;
  char *pcVar2;
  code *pcVar3;
  undefined8 uVar4;
  
  iVar1 = strcasecmp(name,"t");
  if (iVar1 == 0) {
    XML_SetElementHandler(*callbackdata,0,shared_strings_callback_find_shared_string_end);
    uVar4 = *callbackdata;
    pcVar3 = shared_strings_callback_string_data;
  }
  else {
    iVar1 = strcasecmp(name,"rPh");
    if (iVar1 != 0) {
      return;
    }
    pcVar2 = strdup(name);
    *(char **)((long)callbackdata + 0x30) = pcVar2;
    *(undefined8 *)((long)callbackdata + 0x38) = 1;
    *(code **)((long)callbackdata + 0x40) = shared_strings_callback_find_shared_string_start;
    *(code **)((long)callbackdata + 0x48) = shared_strings_callback_find_shared_stringitem_end;
    *(undefined8 *)((long)callbackdata + 0x50) = 0;
    XML_SetElementHandler
              (*callbackdata,shared_strings_callback_skip_tag_start,
               shared_strings_callback_skip_tag_end);
    uVar4 = *callbackdata;
    pcVar3 = (code *)0x0;
  }
  XML_SetCharacterDataHandler(uVar4,pcVar3);
  return;
}

Assistant:

void shared_strings_callback_find_shared_string_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct shared_strings_callback_data* data = (struct shared_strings_callback_data*)callbackdata;
  if (XML_Char_icmp(name, X("t")) == 0) {
    XML_SetElementHandler(data->xmlparser, NULL, shared_strings_callback_find_shared_string_end);
    XML_SetCharacterDataHandler(data->xmlparser, shared_strings_callback_string_data);
  } else if (XML_Char_icmp(name, X("rPh")) == 0) {
    data->skiptag = XML_Char_dup(name);
    data->skiptagcount = 1;
    data->skip_start = shared_strings_callback_find_shared_string_start;
    data->skip_end = shared_strings_callback_find_shared_stringitem_end;
    data->skip_data = NULL;
    XML_SetElementHandler(data->xmlparser, shared_strings_callback_skip_tag_start, shared_strings_callback_skip_tag_end);
    XML_SetCharacterDataHandler(data->xmlparser, NULL);
  }
}